

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Area.cpp
# Opt level: O2

unsigned_long __thiscall Area::AddRoom(Area *this,shared_ptr<Room> *room)

{
  unsigned_long uVar1;
  
  std::vector<std::shared_ptr<Room>,_std::allocator<std::shared_ptr<Room>_>_>::push_back
            (&this->m_rooms,room);
  uVar1 = ((long)(this->m_rooms).
                 super__Vector_base<std::shared_ptr<Room>,_std::allocator<std::shared_ptr<Room>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_rooms).
                 super__Vector_base<std::shared_ptr<Room>,_std::allocator<std::shared_ptr<Room>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4) - 1;
  Room::SetID((room->super___shared_ptr<Room,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,(int)uVar1);
  return uVar1;
}

Assistant:

unsigned long Area::AddRoom(std::shared_ptr<Room> room) {
    m_rooms.push_back(room);
    u_long room_id = m_rooms.size() - 1;
    room->SetID((int)room_id);
    return room_id;
}